

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O3

void __thiscall QProcessPrivate::Channel::clear(Channel *this)

{
  QProcessPrivate *pQVar1;
  QArrayData *data;
  long lVar2;
  long lVar3;
  
  if (this->type == PipeSource) {
    lVar2 = 0x1a0;
    lVar3 = 0x1b8;
  }
  else {
    if (this->type != PipeSink) goto LAB_0041ba8a;
    lVar2 = 0x1d8;
    lVar3 = 0x1f0;
  }
  pQVar1 = this->process;
  *(undefined1 *)
   ((long)&(pQVar1->super_QIODevicePrivate).super_QObjectPrivate.super_QObjectData._vptr_QObjectData
   + lVar3) = 0;
  *(undefined8 *)
   ((long)&(pQVar1->super_QIODevicePrivate).super_QObjectPrivate.super_QObjectData._vptr_QObjectData
   + lVar2) = 0;
LAB_0041ba8a:
  this->type = Normal;
  if ((this->file).d.ptr != (char16_t *)0x0) {
    data = &((this->file).d.d)->super_QArrayData;
    (this->file).d.d = (Data *)0x0;
    (this->file).d.ptr = (char16_t *)0x0;
    (this->file).d.size = 0;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
      }
    }
  }
  this->process = (QProcessPrivate *)0x0;
  return;
}

Assistant:

void QProcessPrivate::Channel::clear()
{
    switch (type) {
    case PipeSource:
        Q_ASSERT(process);
        process->stdinChannel.type = Normal;
        process->stdinChannel.process = nullptr;
        break;
    case PipeSink:
        Q_ASSERT(process);
        process->stdoutChannel.type = Normal;
        process->stdoutChannel.process = nullptr;
        break;
    default:
        break;
    }

    type = Normal;
    file.clear();
    process = nullptr;
}